

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBoolean.cpp
# Opt level: O1

Var Js::JavascriptBoolean::EntryValueOf(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  JavascriptLibrary *this;
  code *pcVar2;
  bool bVar3;
  BOOL value;
  undefined4 *puVar4;
  Var pvVar5;
  JavascriptBoolean *aValue;
  JavascriptBooleanObject *this_00;
  int in_stack_00000010;
  undefined1 local_38 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBoolean.cpp"
                                ,0x44,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bc1fb1;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_38 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_38,(CallInfo *)&args.super_Arguments.Values);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBoolean.cpp"
                                ,0x47,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00bc1fb1:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pvVar5 = Arguments::operator[]((Arguments *)local_38,0);
  bVar3 = VarIs<Js::JavascriptBoolean>(pvVar5);
  aValue = (JavascriptBoolean *)Arguments::operator[]((Arguments *)local_38,0);
  if (!bVar3) {
    bVar3 = VarIs<Js::JavascriptBooleanObject>(aValue);
    if (bVar3) {
      pvVar5 = Arguments::operator[]((Arguments *)local_38,0);
      this_00 = VarTo<Js::JavascriptBooleanObject>(pvVar5);
      this = (pSVar1->super_ScriptContextBase).javascriptLibrary;
      value = JavascriptBooleanObject::GetValue(this_00);
      aValue = JavascriptLibrary::CreateBoolean(this,value);
    }
    else {
      aValue = (JavascriptBoolean *)
               TryInvokeRemotelyOrThrow
                         (EntryValueOf,pSVar1,(Arguments *)local_38,-0x7ff5ec3e,
                          L"Boolean.prototype.valueOf");
    }
  }
  return aValue;
}

Assistant:

Var JavascriptBoolean::EntryValueOf(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if(VarIs<JavascriptBoolean>(args[0]))
        {
            return args[0];
        }
        else if (VarIs<JavascriptBooleanObject>(args[0]))
        {
            JavascriptBooleanObject* booleanObject = VarTo<JavascriptBooleanObject>(args[0]);
            return scriptContext->GetLibrary()->CreateBoolean(booleanObject->GetValue());
        }
        else
        {
            return TryInvokeRemotelyOrThrow(EntryValueOf, scriptContext, args, JSERR_This_NeedBoolean, _u("Boolean.prototype.valueOf"));
        }
    }